

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::ReadGroup<google::protobuf::Message>
               (int field_number,CodedInputStream *input,Message *value)

{
  bool bVar1;
  uint32 expected;
  CodedInputStream *in_RSI;
  int in_EDI;
  CodedInputStream *in_stack_00000110;
  MessageLite *in_stack_00000118;
  undefined1 local_1;
  
  bVar1 = io::CodedInputStream::IncrementRecursionDepth(in_RSI);
  if (bVar1) {
    bVar1 = MessageLite::MergePartialFromCodedStream(in_stack_00000118,in_stack_00000110);
    if (bVar1) {
      io::CodedInputStream::UnsafeDecrementRecursionDepth(in_RSI);
      expected = MakeTag(in_EDI,WIRETYPE_END_GROUP);
      bVar1 = io::CodedInputStream::LastTagWas(in_RSI,expected);
      if (bVar1) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool WireFormatLite::ReadGroup(int field_number,
                                      io::CodedInputStream* input,
                                      MessageType* value) {
  if (!input->IncrementRecursionDepth()) return false;
  if (!value->MergePartialFromCodedStream(input)) return false;
  input->UnsafeDecrementRecursionDepth();
  // Make sure the last thing read was an end tag for this group.
  if (!input->LastTagWas(MakeTag(field_number, WIRETYPE_END_GROUP))) {
    return false;
  }
  return true;
}